

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall DnsStats::SubmitRegistryNumber(DnsStats *this,uint32_t registry_id,uint32_t number)

{
  bool stored;
  bool local_69;
  DnsHashEntry local_68;
  
  local_68.HashNext = (DnsHashEntry *)0x0;
  local_69 = false;
  local_68.count = 1;
  local_68._8_8_ = (ulong)registry_id << 0x20;
  local_68.key_type = 0;
  local_68.key_length = 4;
  local_68.field_6.key_number = number;
  BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_68,true,&local_69);
  return;
}

Assistant:

void DnsStats::SubmitRegistryNumber(uint32_t registry_id, uint32_t number)
{
    SubmitRegistryNumberAndCount(registry_id, number, 1);
}